

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

Workitem * __thiscall
LinkedListPool<depspawn::internal::Workitem,true,false>::malloc<depspawn::internal::arg_info*&,int&>
          (LinkedListPool<depspawn::internal::Workitem,true,false> *this,arg_info **args,int *args_1
          )

{
  Workitem *this_00;
  
  this_00 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)this);
  depspawn::internal::Workitem::Workitem(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }